

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O3

void __thiscall SQLite::Statement::bindNoCopy(Statement *this,int aIndex,char *apValue)

{
  int ret;
  Exception *this_00;
  
  ret = sqlite3_bind_text((this->mStmtPtr).mpStmt,aIndex,apValue,-1,(_func_void_void_ptr *)0x0);
  if (ret == 0) {
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  Exception::Exception(this_00,(this->mStmtPtr).mpSQLite,ret);
  __cxa_throw(this_00,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Statement::bindNoCopy(const int aIndex, const char* apValue)
{
    const int ret = sqlite3_bind_text(mStmtPtr, aIndex, apValue, -1, SQLITE_STATIC);
    check(ret);
}